

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_addsub.h
# Opt level: O1

uint32_t helper_shadd16_arm(uint32_t a,uint32_t b)

{
  return (((int)b >> 0x10) + ((int)a >> 0x10) & 0xfffffffeU) << 0xf |
         (uint)((int)(short)b + (int)(short)a) >> 1 & 0xffff;
}

Assistant:

uint32_t HELPER(glue(PFX,add16))(uint32_t a, uint32_t b GE_ARG)
{
    uint32_t res = 0;
    DECLARE_GE;

    ADD16(a, b, 0);
    ADD16(a >> 16, b >> 16, 1);
    SET_GE;
    return res;
}